

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderMultisampleInterpolationStateQueryTests::init
          (ShaderMultisampleInterpolationStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  TestNode *pTVar4;
  long lVar5;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "min_fragment_interpolation_offset","Test MIN_FRAGMENT_INTERPOLATION_OFFSET");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0x10;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&PTR_iterate_0219df00 + lVar5);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,*(char **)(&UNK_0219df08 + lVar5),
               *(char **)((long)&init::verifiers[0].verifier + lVar5));
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219df98;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x70);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "max_fragment_interpolation_offset","Test MAX_FRAGMENT_INTERPOLATION_OFFSET");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0x10;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&PTR_iterate_0219df00 + lVar5);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,*(char **)(&UNK_0219df08 + lVar5),
               *(char **)((long)&init::verifiers[0].verifier + lVar5));
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219df98;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = 1;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x70);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "fragment_interpolation_offset_bits","Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0x10;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&PTR_iterate_0219df00 + lVar5);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,*(char **)(&UNK_0219df08 + lVar5),
               *(char **)((long)&init::verifiers[0].verifier + lVar5));
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219dfe8;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x70);
  return extraout_EAX;
}

Assistant:

void ShaderMultisampleInterpolationStateQueryTests::init (void)
{
	static const struct Verifier
	{
		QueryType		verifier;
		const char*		name;
		const char*		desc;
	} verifiers[] =
	{
		{ QUERY_BOOLEAN,	"get_boolean",		"Test using getBoolean"		},
		{ QUERY_INTEGER,	"get_integer",		"Test using getInteger"		},
		{ QUERY_FLOAT,		"get_float",		"Test using getFloat"		},
		{ QUERY_INTEGER64,	"get_integer64",	"Test using getInteger64"	},
	};

	// .min_fragment_interpolation_offset
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "min_fragment_interpolation_offset", "Test MIN_FRAGMENT_INTERPOLATION_OFFSET");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new InterpolationOffsetCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier, InterpolationOffsetCase::TEST_MIN_OFFSET));
	}

	// .max_fragment_interpolation_offset
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "max_fragment_interpolation_offset", "Test MAX_FRAGMENT_INTERPOLATION_OFFSET");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new InterpolationOffsetCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier, InterpolationOffsetCase::TEST_MAX_OFFSET));
	}

	// .fragment_interpolation_offset_bits
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "fragment_interpolation_offset_bits", "Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new FragmentInterpolationOffsetBitsCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier));
	}
}